

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O2

intptr_t fiobj_data_pos(FIOBJ io)

{
  size_t sVar1;
  intptr_t *piVar2;
  intptr_t iVar3;
  fiobj_type_enum in_SIL;
  
  iVar3 = -1;
  if (io != 0) {
    sVar1 = fiobj_type_is(io,in_SIL);
    if (sVar1 != 0) {
      piVar2 = (intptr_t *)(io + 0x10);
      if (0xfffffffd < *(uint *)(io + 0x30)) {
        piVar2 = (intptr_t *)(io + 0x28);
      }
      iVar3 = *piVar2;
    }
  }
  return iVar3;
}

Assistant:

intptr_t fiobj_data_pos(FIOBJ io) {
  if (!io || !FIOBJ_TYPE_IS(io, FIOBJ_T_DATA))
    return -1;
  switch (obj2io(io)->fd) {
  case -1: /* fallthrough */
  case -2:
    return obj2io(io)->pos;
    break;
  default:
    return obj2io(io)->source.fpos;
  }
}